

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_trace_tests.cpp
# Opt level: O0

void __thiscall
iu_ScopedTraceTest_x_iutest_x_Test_Test::iu_ScopedTraceTest_x_iutest_x_Test_Test
          (iu_ScopedTraceTest_x_iutest_x_Test_Test *this)

{
  iu_ScopedTraceTest_x_iutest_x_Test_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_ScopedTraceTest_x_iutest_x_Test_Test_001641b0;
  return;
}

Assistant:

IUTEST(ScopedTraceTest, Test)
{
#if !defined(IUTEST_USE_GTEST)
    static TestLogger logger1, logger2, logger3;
    ::iutest::detail::iuConsole::SetLogger(&logger1);
#endif

    {
        IUTEST_SCOPED_TRACE("Test Scope 1");
        IUTEST_INFORM_EQ(0, 1);

#if !defined(IUTEST_USE_GTEST)
        IUTEST_ASSERT_STRIN("Test Scope 1", logger1.c_str());
        ::iutest::detail::iuConsole::SetLogger(&logger2);
#endif
        {
            IUTEST_SCOPED_TRACE("Test Scope 2");
            IUTEST_INFORM_EQ(0, 1);

#if !defined(IUTEST_USE_GTEST)
            IUTEST_ASSERT_STRIN("Test Scope 1", logger2.c_str());
            IUTEST_ASSERT_STRIN("Test Scope 2", logger2.c_str());
            ::iutest::detail::iuConsole::SetLogger(&logger3);
#endif
        }
    }

    IUTEST_SCOPED_TRACE("Test Scope 3");
    IUTEST_INFORM_EQ(0, 1);

#if !defined(IUTEST_USE_GTEST)
    IUTEST_ASSERT_STRIN("Test Scope 3", logger3.c_str());
    ::iutest::detail::iuConsole::SetLogger(NULL);
#endif
}